

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  size_t __n;
  _Alloc_hider _Var2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  LogMessage *other;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar6;
  long *plVar7;
  _func_int **pp_Var8;
  byte bVar9;
  ulong uVar10;
  size_type *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar12;
  long i;
  bool bVar13;
  long lVar14;
  float fVar15;
  int64 value;
  int64 int_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  EnumDescriptor *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  TVar4 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4)) {
  case 1:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_d8,0x7fffffff);
    if (!bVar3) {
      return false;
    }
    bVar3 = *(int *)(field + 0x4c) == 3;
    uVar10 = local_d8._0_8_ & 0xffffffff;
    pp_Var8 = reflection->_vptr_Reflection;
    lVar12 = 0x208;
    lVar14 = 0xe8;
    goto LAB_005c6a37;
  case 2:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_d8,0x7fffffffffffffff);
    if (!bVar3) {
      return false;
    }
    iVar5 = *(int *)(field + 0x4c);
    pp_Var8 = reflection->_vptr_Reflection;
    lVar12 = 0x210;
    lVar14 = 0xf0;
    goto LAB_005c6993;
  case 3:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_d8,0xffffffff);
    if (!bVar3) {
      return false;
    }
    bVar3 = *(int *)(field + 0x4c) == 3;
    uVar10 = local_d8._0_8_ & 0xffffffff;
    pp_Var8 = reflection->_vptr_Reflection;
    lVar12 = 0x218;
    lVar14 = 0xf8;
    goto LAB_005c6a37;
  case 4:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_d8,0xffffffffffffffff);
    if (!bVar3) {
      return false;
    }
    iVar5 = *(int *)(field + 0x4c);
    pp_Var8 = reflection->_vptr_Reflection;
    lVar12 = 0x220;
    lVar14 = 0x100;
LAB_005c6993:
    if (iVar5 == 3) {
      lVar14 = lVar12;
    }
    (**(code **)((long)pp_Var8 + lVar14))(reflection,message,field,local_d8._0_8_);
    break;
  case 5:
    bVar3 = ConsumeDouble(this,(double *)local_d8);
    if (!bVar3) {
      return false;
    }
    iVar5 = *(int *)(field + 0x4c);
    fVar15 = (float)local_d8._0_8_;
    pp_Var8 = reflection->_vptr_Reflection;
    lVar12 = 0x230;
    lVar14 = 0x110;
    goto LAB_005c69de;
  case 6:
    bVar3 = ConsumeDouble(this,(double *)local_d8);
    if (!bVar3) {
      return false;
    }
    iVar5 = *(int *)(field + 0x4c);
    fVar15 = io::SafeDoubleToFloat((double)local_d8._0_8_);
    pp_Var8 = reflection->_vptr_Reflection;
    lVar12 = 0x228;
    lVar14 = 0x108;
LAB_005c69de:
    if (iVar5 == 3) {
      lVar14 = lVar12;
    }
    (**(code **)((long)pp_Var8 + lVar14))(fVar15,reflection,message,field);
    break;
  case 7:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      local_d8._8_8_ = (char *)0x0;
      local_d8[0x10] = '\0';
      local_d8._0_8_ = local_d8 + 0x10;
      bVar3 = ConsumeIdentifier(this,(string *)local_d8);
      if (bVar3) {
        iVar5 = std::__cxx11::string::compare(local_d8);
        if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare(local_d8), iVar5 == 0)) ||
           (iVar5 = std::__cxx11::string::compare(local_d8), iVar5 == 0)) {
          if (*(int *)(field + 0x4c) == 3) {
            pp_Var8 = reflection->_vptr_Reflection + 0x47;
          }
          else {
            pp_Var8 = reflection->_vptr_Reflection + 0x23;
          }
          bVar9 = 1;
        }
        else {
          iVar5 = std::__cxx11::string::compare(local_d8);
          if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare(local_d8), iVar5 != 0)) &&
             (iVar5 = std::__cxx11::string::compare(local_d8), iVar5 != 0)) {
            std::operator+(&local_60,"Invalid value for boolean field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
            psVar11 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_a0.field_2._M_allocated_capacity = *psVar11;
              local_a0.field_2._8_8_ = plVar7[3];
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar11;
              local_a0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_a0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::operator+(&local_80,&local_a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
            psVar11 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_f8.field_2._M_allocated_capacity = *psVar11;
              local_f8.field_2._8_8_ = plVar7[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar11;
              local_f8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_f8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        &local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(int)local_80._M_dataplus._M_p) !=
                &local_80.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                       (int)local_80._M_dataplus._M_p),
                              local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            goto LAB_005c71f3;
          }
          if (*(int *)(field + 0x4c) == 3) {
            pp_Var8 = reflection->_vptr_Reflection + 0x47;
          }
          else {
            pp_Var8 = reflection->_vptr_Reflection + 0x23;
          }
          bVar9 = 0;
        }
        bVar3 = true;
        (**pp_Var8)(reflection,message,field,(ulong)bVar9);
      }
      else {
LAB_005c71f3:
        bVar3 = false;
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
      }
      goto joined_r0x005c6ab9;
    }
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_d8,1);
    if (!bVar3) {
      return false;
    }
    uVar10 = (ulong)((pointer)local_d8._0_8_ != (pointer)0x0);
    bVar3 = *(int *)(field + 0x4c) == 3;
    pp_Var8 = reflection->_vptr_Reflection;
    lVar12 = 0x238;
    lVar14 = 0x118;
LAB_005c6a37:
    if (bVar3) {
      lVar14 = lVar12;
    }
    (**(code **)((long)pp_Var8 + lVar14))(reflection,message,field,uVar10);
    break;
  case 8:
    local_d8._0_8_ = local_d8 + 0x10;
    local_d8._8_8_ = (char *)0x0;
    local_d8[0x10] = '\0';
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,(string *)local_d8);
      if (!bVar3) goto LAB_005c70b1;
      pEVar6 = EnumDescriptor::FindValueByName(this_00,(string *)local_d8);
LAB_005c6d64:
      if (pEVar6 != (EnumValueDescriptor *)0x0) {
        lVar14 = 0x128;
        if (*(int *)(field + 0x4c) == 3) {
          lVar14 = 0x248;
        }
        (**(code **)((long)reflection->_vptr_Reflection + lVar14))(reflection,message,field,pEVar6);
        bVar3 = false;
        goto LAB_005c70b4;
      }
      if (this->allow_unknown_enum_ == false) {
        std::operator+(&local_60,"Unknown enumeration value of \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_a0.field_2._M_allocated_capacity = *psVar11;
          local_a0.field_2._8_8_ = plVar7[3];
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar11;
          local_a0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_a0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::operator+(&local_80,&local_a0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field)
        ;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_f8.field_2._M_allocated_capacity = *psVar11;
          local_f8.field_2._8_8_ = plVar7[3];
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar11;
          local_f8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_f8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(int)local_80._M_dataplus._M_p) !=
            &local_80.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_80._M_dataplus._M_p._4_4_,(int)local_80._M_dataplus._M_p),
                          local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_005c70a9;
        goto LAB_005c70b1;
      }
      std::operator+(&local_60,"Unknown enumeration value of \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_a0.field_2._M_allocated_capacity = *psVar11;
        local_a0.field_2._8_8_ = plVar7[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar11;
        local_a0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_a0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+(&local_80,&local_a0,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_f8.field_2._M_allocated_capacity = *psVar11;
        local_f8.field_2._8_8_ = plVar7[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar11;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(int)local_80._M_dataplus._M_p) !=
          &local_80.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_80._M_dataplus._M_p._4_4_,(int)local_80._M_dataplus._M_p),
                        local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      bVar3 = true;
      bVar13 = true;
    }
    else {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-","");
      _Var2._M_p = local_f8._M_dataplus._M_p;
      __rhs = &(this->tokenizer_).current_.text;
      __n = (this->tokenizer_).current_.text._M_string_length;
      if ((__n == local_f8._M_string_length) &&
         ((__n == 0 ||
          (local_38 = __rhs, iVar5 = bcmp((__rhs->_M_dataplus)._M_p,local_f8._M_dataplus._M_p,__n),
          __rhs = local_38, iVar5 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_f8.field_2) {
          operator_delete(_Var2._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
LAB_005c6cfc:
        bVar3 = ConsumeSignedInteger(this,(int64 *)&local_80,0x7fffffff);
        if (bVar3) {
          SimpleItoa_abi_cxx11_
                    (&local_f8,
                     (protobuf *)
                     CONCAT44(local_80._M_dataplus._M_p._4_4_,(int)local_80._M_dataplus._M_p),i);
          std::__cxx11::string::operator=((string *)local_d8,(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          pEVar6 = EnumDescriptor::FindValueByNumber(this_00,(int)local_80._M_dataplus._M_p);
          goto LAB_005c6d64;
        }
      }
      else {
        TVar1 = (this->tokenizer_).current_.type;
        local_40 = this_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_f8.field_2) {
          operator_delete(_Var2._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_40;
        if (TVar1 == TYPE_INTEGER) goto LAB_005c6cfc;
        std::operator+(&local_f8,"Expected integer or identifier, got: ",__rhs);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_f8);
        local_60.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
        local_60._M_dataplus._M_p = local_f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_005c70b1;
LAB_005c70a9:
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
LAB_005c70b1:
      bVar3 = true;
LAB_005c70b4:
      bVar13 = false;
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    if (bVar3) {
      return bVar13;
    }
    break;
  case 9:
    local_d8._8_8_ = (char *)0x0;
    local_d8[0x10] = '\0';
    local_d8._0_8_ = local_d8 + 0x10;
    bVar3 = ConsumeString(this,(string *)local_d8);
    if (bVar3) {
      lVar14 = 0x120;
      if (*(int *)(field + 0x4c) == 3) {
        lVar14 = 0x240;
      }
      (**(code **)((long)reflection->_vptr_Reflection + lVar14))(reflection,message,field,local_d8);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
joined_r0x005c6ab9:
    if (!bVar3) {
      return false;
    }
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x2f4);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_d8,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)&local_f8,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_d8);
  }
  return true;
}

Assistant:

bool ConsumeFieldValue(Message* message,
                         const Reflection* reflection,
                         const FieldDescriptor* field) {

// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                                  \
        if (field->is_repeated()) {                                \
          reflection->Add##CPPTYPE(message, field, VALUE);         \
        } else {                                                   \
          reflection->Set##CPPTYPE(message, field, VALUE);         \
        }                                                          \

    switch(field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name()
                        + "\". Value: \"" + value  + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        string value;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = NULL;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          int64 int_value;
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = SimpleItoa(int_value);        // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == NULL) {
          if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value  + "\" for "
                        "field \"" + field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value  + "\" for "
                          "field \"" + field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }